

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O1

bool StoreFrameValue(InstructionVMEvalContext *ctx,VmConstant *pointer,int offset,VmConstant *value,
                    uint storeSize)

{
  FunctionData *pFVar1;
  SynIdentifier *pSVar2;
  bool bVar3;
  Storage *this;
  char *pcVar4;
  int iVar5;
  uint offset_00;
  byte bVar6;
  uint base;
  uint local_34;
  
  local_34 = 0;
  this = FindTarget(ctx,pointer,&local_34);
  if (this != (Storage *)0x0) {
    if (ctx->printExecution == true) {
      pcVar4 = "---";
      iVar5 = 0x2108d5;
      if ((this->functionOwner != (VmFunction *)0x0) &&
         (pFVar1 = this->functionOwner->function, pFVar1 != (FunctionData *)0x0)) {
        pSVar2 = pFVar1->name;
        pcVar4 = (pSVar2->name).begin;
        iVar5 = (int)(pSVar2->name).end;
      }
      printf("      StoreFrameValue %.*s [%s] @ %04x + %02x [%02x]\n",
             (ulong)(uint)(iVar5 - (int)pcVar4),pcVar4,this->tag,(ulong)local_34,
             (ulong)(ushort)pointer->iValue,storeSize);
    }
    offset_00 = offset + local_34 + (uint)(ushort)pointer->iValue;
    bVar3 = InstructionVMEvalContext::Storage::Reserve
                      (this,ctx,offset_00,(value->super_VmValue).type.size);
    pointer = (VmConstant *)(ulong)bVar3;
    if (bVar3) {
      CopyConstantRaw(ctx,(this->data).data + offset_00,(this->data).count - offset_00,value,
                      storeSize);
    }
    else {
      anon_unknown.dwarf_156b67::Report(ctx,"ERROR: out of stack space");
    }
  }
  bVar6 = (byte)pointer;
  if (this == (Storage *)0x0) {
    if (ctx->hasError == false) {
      __assert_fail("ctx.hasError",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x260,
                    "bool StoreFrameValue(InstructionVMEvalContext &, VmConstant *, int, VmConstant *, unsigned int)"
                   );
    }
    bVar6 = 0;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool StoreFrameValue(InstructionVMEvalContext &ctx, VmConstant *pointer, int offset, VmConstant *value, unsigned storeSize)
{
	unsigned base = 0;

	if(InstructionVMEvalContext::Storage *target = FindTarget(ctx, pointer, base))
	{
		if(ctx.printExecution)
		{
			InplaceStr functionName = target->functionOwner && target->functionOwner->function ? target->functionOwner->function->name->name : InplaceStr("---");

			printf("      StoreFrameValue %.*s [%s] @ %04x + %02x [%02x]\n", FMT_ISTR(functionName), target->tag, base, pointer->iValue & memoryOffsetMask, storeSize);
		}

		unsigned location = (pointer->iValue & memoryOffsetMask) + base;

		location += offset;

		if(!target->Reserve(ctx, location, value->type.size))
		{
			Report(ctx, "ERROR: out of stack space");
			return false;
		}

		CopyConstantRaw(ctx, target->data.data + location, target->data.size() - location, value, storeSize);

		return true;
	}

	assert(ctx.hasError);

	return false;
}